

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_map_set(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic)

{
  list_head *plVar1;
  list_head *plVar2;
  JSValueUnion ctx_00;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  JSRefCountHeader *p_3;
  JSMapState *s;
  JSMapRecord *pJVar6;
  list_head *plVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  int64_t iVar11;
  int64_t extraout_RDX;
  list_head *extraout_RDX_00;
  list_head *plVar12;
  JSRefCountHeader *p_2;
  ulong uVar13;
  int *piVar14;
  JSObject *p;
  JSValueUnion JVar15;
  JSValueUnion JVar16;
  JSValue key;
  JSValue key_00;
  JSValue JVar17;
  JSValue key_01;
  ulong local_58;
  int64_t local_50;
  ulong local_38;
  
  JVar15 = this_val.u;
  s = (JSMapState *)JS_GetOpaque2(ctx,this_val,magic + 0x1f);
  iVar11 = 6;
  if (s == (JSMapState *)0x0) {
    uVar13 = 0;
    uVar8 = 0;
    goto LAB_0013b497;
  }
  JVar16 = (JSValueUnion)argv->tag;
  ctx_00.ptr = (argv->u).ptr;
  if (((ulong)(argv->u).ptr & 0x7fffffffffffffff) == 0 && (argv->tag & 0xffffffffU) == 7) {
    JVar16.float64 = 0.0;
    ctx_00.float64 = 0.0;
  }
  if ((s->is_weak == 0) || (JVar16.int32 == 0xffffffff)) {
    if ((magic & 1U) == 0) {
      local_50 = argv[1].tag;
      local_58 = (ulong)argv[1].u.ptr & 0xffffffff;
      uVar13 = (ulong)argv[1].u.ptr & 0xffffffff00000000;
    }
    else {
      local_50 = 3;
      local_58 = 0;
      uVar13 = 0;
    }
    key_01.tag = (int64_t)JVar16.ptr;
    key_01.u.ptr = ctx_00.ptr;
    pJVar6 = map_find_record(ctx,s,key_01);
    if (pJVar6 == (JSMapRecord *)0x0) {
      pJVar6 = (JSMapRecord *)js_malloc(ctx,0x58);
      if (pJVar6 == (JSMapRecord *)0x0) goto LAB_0013b3e1;
      pJVar6->ref_count = 1;
      pJVar6->empty = 0;
      pJVar6->map = s;
      if (s->is_weak == 0) {
        if (0xfffffff4 < (uint)JVar16.int32) {
          *(int *)ctx_00.ptr = *ctx_00.ptr + 1;
        }
      }
      else {
        pJVar6->next_weak_ref = *(JSMapRecord **)((long)ctx_00.ptr + 0x28);
        *(JSMapRecord **)((long)ctx_00.ptr + 0x28) = pJVar6;
      }
      (pJVar6->key).u.ptr = (void *)ctx_00;
      (pJVar6->key).tag = (int64_t)JVar16;
      key.tag = extraout_RDX;
      key.u.float64 = JVar16.float64;
      uVar3 = map_hash_key((JSContext *)ctx_00.ptr,key);
      uVar4 = s->hash_size;
      uVar10 = uVar4 - 1 & uVar3;
      plVar7 = s->hash_table;
      plVar12 = plVar7[uVar10].prev;
      plVar12->next = &pJVar6->hash_link;
      (pJVar6->hash_link).prev = plVar12;
      (pJVar6->hash_link).next = plVar7 + uVar10;
      plVar7[uVar10].prev = &pJVar6->hash_link;
      plVar12 = (s->records).prev;
      plVar12->next = &pJVar6->link;
      (pJVar6->link).prev = plVar12;
      (pJVar6->link).next = &s->records;
      (s->records).prev = &pJVar6->link;
      uVar10 = s->record_count + 1;
      s->record_count = uVar10;
      if (s->record_count_threshold <= uVar10) {
        uVar8 = 4;
        if (uVar4 != 1) {
          uVar8 = (ulong)(uVar4 * 2);
        }
        plVar7 = (list_head *)js_realloc2(ctx,plVar7,uVar8 << 4,&local_38);
        if (plVar7 != (list_head *)0x0) {
          uVar10 = (int)uVar8 + (int)(local_38 >> 4);
          plVar12 = extraout_RDX_00;
          for (lVar9 = 0; (ulong)uVar10 << 4 != lVar9; lVar9 = lVar9 + 0x10) {
            plVar12 = (list_head *)((long)&plVar7->prev + lVar9);
            *(list_head **)((long)&plVar7->prev + lVar9) = plVar12;
            *(list_head **)((long)&plVar7->next + lVar9) = plVar12;
          }
          plVar1 = &s->records;
          while (plVar1 = plVar1->next, plVar1 != &s->records) {
            if (*(int *)((long)&plVar1[-2].next + 4) == 0) {
              key_00.tag = (int64_t)plVar12;
              key_00.u = (JSValueUnion)(JSValueUnion)plVar1[2].next;
              uVar4 = map_hash_key((JSContext *)plVar1[2].prev,key_00);
              uVar5 = uVar4 & uVar10 - 1;
              plVar12 = plVar7 + uVar5;
              plVar2 = plVar7[uVar5].prev;
              plVar2->next = plVar1 + 1;
              plVar1[1].prev = plVar2;
              plVar1[1].next = plVar12;
              plVar7[uVar5].prev = plVar1 + 1;
            }
          }
          s->hash_table = plVar7;
          s->hash_size = uVar10;
          s->record_count_threshold = uVar10 * 2;
        }
      }
    }
    else {
      JS_FreeValue(ctx,pJVar6->value);
    }
    piVar14 = (int *)(uVar13 | local_58);
    if (0xfffffff4 < (uint)local_50) {
      *piVar14 = *piVar14 + 1;
    }
    (pJVar6->value).u.ptr = piVar14;
    (pJVar6->value).tag = local_50;
    if (0xfffffff4 < (uint)this_val.tag) {
      *(int *)JVar15.ptr = *JVar15.ptr + 1;
    }
    uVar8 = (ulong)JVar15.ptr & 0xffffffff00000000;
    uVar13 = (ulong)JVar15.ptr & 0xffffffff;
    iVar11 = this_val.tag;
  }
  else {
    JS_ThrowTypeErrorNotAnObject(ctx);
LAB_0013b3e1:
    uVar13 = 0;
    uVar8 = 0;
    iVar11 = 6;
  }
LAB_0013b497:
  JVar17.u.ptr = (void *)(uVar13 | uVar8);
  JVar17.tag = iVar11;
  return JVar17;
}

Assistant:

static JSValue js_map_set(JSContext *ctx, JSValueConst this_val,
                          int argc, JSValueConst *argv, int magic)
{
    JSMapState *s = JS_GetOpaque2(ctx, this_val, JS_CLASS_MAP + magic);
    JSMapRecord *mr;
    JSValueConst key, value;

    if (!s)
        return JS_EXCEPTION;
    key = map_normalize_key(ctx, argv[0]);
    if (s->is_weak && !JS_IsObject(key))
        return JS_ThrowTypeErrorNotAnObject(ctx);
    if (magic & MAGIC_SET)
        value = JS_UNDEFINED;
    else
        value = argv[1];
    mr = map_find_record(ctx, s, key);
    if (mr) {
        JS_FreeValue(ctx, mr->value);
    } else {
        mr = map_add_record(ctx, s, key);
        if (!mr)
            return JS_EXCEPTION;
    }
    mr->value = JS_DupValue(ctx, value);
    return JS_DupValue(ctx, this_val);
}